

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_sleep(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  int64_t delay;
  timespec ts;
  
  iVar1 = JS_ToInt64(ctx,&delay,*argv);
  if (iVar1 == 0) {
    if (delay < 0) {
      delay = 0;
    }
    ts.tv_sec = (ulong)delay / 1000;
    iVar4 = 0;
    ts.tv_nsec = ((ulong)delay % 1000) * 1000000;
    iVar1 = nanosleep((timespec *)&ts,(timespec *)0x0);
    uVar3 = js_get_errno((long)iVar1);
    JVar2.ptr = (void *)(uVar3 & 0xffffffff);
  }
  else {
    iVar4 = 6;
    JVar2.float64 = 0.0;
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_sleep(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int64_t delay;
    int ret;
    
    if (JS_ToInt64(ctx, &delay, argv[0]))
        return JS_EXCEPTION;
    if (delay < 0)
        delay = 0;
#if defined(_WIN32)
    {
        if (delay > INT32_MAX)
            delay = INT32_MAX;
        Sleep(delay);
        ret = 0;
    }
#else
    {
        struct timespec ts;

        ts.tv_sec = delay / 1000;
        ts.tv_nsec = (delay % 1000) * 1000000;
        ret = js_get_errno(nanosleep(&ts, NULL));
    }
#endif
    return JS_NewInt32(ctx, ret);
}